

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_Escape_Test::TestBody(PrintfTest_Escape_Test *this)

{
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  wchar_t (*in_stack_fffffffffffffc38) [15];
  wstring *expected;
  char *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  int line;
  char *in_stack_fffffffffffffc50;
  wstring *file;
  undefined8 in_stack_fffffffffffffc58;
  Type type;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  wchar_t (*in_stack_fffffffffffffc68) [10];
  wstring *format_04;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  AssertHelper *in_stack_fffffffffffffcb0;
  AssertHelper *this_00;
  wstring local_2d8 [32];
  AssertionResult local_2b8 [2];
  wstring local_298 [32];
  AssertionResult local_278 [2];
  wstring local_258 [32];
  AssertionResult local_238 [2];
  wstring local_218 [32];
  AssertionResult local_1f8 [2];
  wstring local_1d8 [32];
  AssertionResult local_1b8 [3];
  AssertHelper local_188 [4];
  AssertionResult local_168 [3];
  string local_138 [32];
  AssertionResult local_118 [3];
  string local_e8 [32];
  AssertionResult local_c8 [3];
  string local_98 [32];
  AssertionResult local_78 [4];
  string local_38 [32];
  AssertionResult local_18;
  
  type = (Type)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
            );
  format.data_._7_1_ = in_stack_fffffffffffffc37;
  format.data_._0_7_ = in_stack_fffffffffffffc30;
  format.size_ = (size_t)in_stack_fffffffffffffc38;
  test_sprintf<>(format);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,(char (*) [2])in_stack_fffffffffffffc38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    testing::AssertionResult::failure_message((AssertionResult *)0x111c14);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),type,
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffcb0,
               (Message *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x111c77);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111ccf);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
            );
  format_00.data_._7_1_ = in_stack_fffffffffffffc37;
  format_00.data_._0_7_ = in_stack_fffffffffffffc30;
  format_00.size_ = (size_t)in_stack_fffffffffffffc38;
  test_sprintf<>(format_00);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,(char (*) [9])in_stack_fffffffffffffc38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::__cxx11::string::~string(local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    testing::AssertionResult::failure_message((AssertionResult *)0x111dd6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),type,
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffcb0,
               (Message *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x111e39);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111e91);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
            );
  format_01.data_._7_1_ = in_stack_fffffffffffffc37;
  format_01.data_._0_7_ = in_stack_fffffffffffffc30;
  format_01.size_ = (size_t)in_stack_fffffffffffffc38;
  test_sprintf<>(format_01);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,(char (*) [8])in_stack_fffffffffffffc38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::__cxx11::string::~string(local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    testing::AssertionResult::failure_message((AssertionResult *)0x111f98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),type,
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffcb0,
               (Message *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x111ffb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x112053);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
            );
  format_02.data_._7_1_ = in_stack_fffffffffffffc37;
  format_02.data_._0_7_ = in_stack_fffffffffffffc30;
  format_02.size_ = (size_t)in_stack_fffffffffffffc38;
  test_sprintf<>(format_02);
  testing::internal::EqHelper<false>::Compare<char[15],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,(char (*) [15])in_stack_fffffffffffffc38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::__cxx11::string::~string(local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    testing::AssertionResult::failure_message((AssertionResult *)0x11215a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),type,
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffcb0,
               (Message *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x1121bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x112215);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
            );
  this_00 = local_188;
  format_03.data_._7_1_ = in_stack_fffffffffffffc37;
  format_03.data_._0_7_ = in_stack_fffffffffffffc30;
  format_03.size_ = (size_t)in_stack_fffffffffffffc38;
  test_sprintf<>(format_03);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,(char (*) [3])in_stack_fffffffffffffc38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::__cxx11::string::~string((string *)local_188);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    testing::AssertionResult::failure_message((AssertionResult *)0x11231c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),type,
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffca8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x112379);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1123ce);
  fmt::v5::sprintf<wchar_t[3]>((wchar_t (*) [3])in_stack_fffffffffffffc68);
  testing::internal::EqHelper<false>::Compare<wchar_t[2],std::__cxx11::wstring>
            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,(wchar_t (*) [2])in_stack_fffffffffffffc38,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::__cxx11::wstring::~wstring(local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    testing::AssertionResult::failure_message((AssertionResult *)0x1124ac);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),type,
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffca8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x112509);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11255e);
  fmt::v5::sprintf<wchar_t[10]>(in_stack_fffffffffffffc68);
  testing::internal::EqHelper<false>::Compare<wchar_t[9],std::__cxx11::wstring>
            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,(wchar_t (*) [9])in_stack_fffffffffffffc38,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::__cxx11::wstring::~wstring(local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
    testing::AssertionResult::failure_message((AssertionResult *)0x11263c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),type,
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffca8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x112699);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1126ee);
  format_04 = local_258;
  fmt::v5::sprintf<wchar_t[9]>((wchar_t (*) [9])format_04);
  testing::internal::EqHelper<false>::Compare<wchar_t[8],std::__cxx11::wstring>
            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,(wchar_t (*) [8])in_stack_fffffffffffffc38,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::__cxx11::wstring::~wstring(local_258);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_238);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffc60));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1127cc);
    type = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffc60),type,
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffca8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x112829);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11287e);
  file = local_298;
  fmt::v5::sprintf<wchar_t[16]>((wchar_t (*) [16])format_04);
  testing::internal::EqHelper<false>::Compare<wchar_t[15],std::__cxx11::wstring>
            ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::__cxx11::wstring::~wstring(local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_278);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc4c);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffc60));
    in_stack_fffffffffffffc40 =
         testing::AssertionResult::failure_message((AssertionResult *)0x11295c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffc60),type,(char *)file,line,
               in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffca8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x1129b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x112a0e);
  expected = local_2d8;
  fmt::v5::sprintf<wchar_t[4]>((wchar_t (*) [4])format_04);
  testing::internal::EqHelper<false>::Compare<wchar_t[3],std::__cxx11::wstring>
            ((char *)CONCAT44(line,in_stack_fffffffffffffc48),in_stack_fffffffffffffc40,
             (wchar_t (*) [3])expected,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30));
  std::__cxx11::wstring::~wstring(local_2d8);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffffc60));
    testing::AssertionResult::failure_message((AssertionResult *)0x112aec);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffc60),type,(char *)file,line,
               in_stack_fffffffffffffc40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffca8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffc30));
    testing::Message::~Message((Message *)0x112b47);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x112b9c);
  return;
}

Assistant:

TEST(PrintfTest, Escape) {
  EXPECT_EQ("%", test_sprintf("%%"));
  EXPECT_EQ("before %", test_sprintf("before %%"));
  EXPECT_EQ("% after", test_sprintf("%% after"));
  EXPECT_EQ("before % after", test_sprintf("before %% after"));
  EXPECT_EQ("%s", test_sprintf("%%s"));
  EXPECT_EQ(L"%", fmt::sprintf(L"%%"));
  EXPECT_EQ(L"before %", fmt::sprintf(L"before %%"));
  EXPECT_EQ(L"% after", fmt::sprintf(L"%% after"));
  EXPECT_EQ(L"before % after", fmt::sprintf(L"before %% after"));
  EXPECT_EQ(L"%s", fmt::sprintf(L"%%s"));
}